

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O3

char * Lexer::TokenName(Token t)

{
  if (t < (TEOF|BUILD)) {
    return &DAT_00122850 + *(int *)(&DAT_00122850 + (ulong)t * 4);
  }
  return (char *)0x0;
}

Assistant:

const char* Lexer::TokenName(Token t) {
  switch (t) {
  case ERROR:    return "lexing error";
  case BUILD:    return "'build'";
  case COLON:    return "':'";
  case DEFAULT:  return "'default'";
  case EQUALS:   return "'='";
  case IDENT:    return "identifier";
  case INCLUDE:  return "'include'";
  case INDENT:   return "indent";
  case NEWLINE:  return "newline";
  case PIPE2:    return "'||'";
  case PIPE:     return "'|'";
  case POOL:     return "'pool'";
  case RULE:     return "'rule'";
  case SUBNINJA: return "'subninja'";
  case TEOF:     return "eof";
  }
  return NULL;  // not reached
}